

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Serialization_Test<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Serialization_Test<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  key_type kVar4;
  value_type vVar5;
  key_type kVar6;
  Type type;
  key_type kVar7;
  key_type kVar8;
  FILE *assertion_result;
  reference expected_predicate_value;
  AssertHelper *this_00;
  reference file;
  char *pcVar9;
  bool *success;
  key_type *key;
  long in_RDI;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  TypeParam ht_in;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  FILE *fp;
  int i;
  TypeParam ht_out;
  bool *in_stack_fffffffffffff9a8;
  undefined4 in_stack_fffffffffffff9b0;
  undefined4 in_stack_fffffffffffff9b4;
  int *in_stack_fffffffffffff9b8;
  undefined4 in_stack_fffffffffffff9c0;
  undefined4 in_stack_fffffffffffff9c4;
  key_equal *in_stack_fffffffffffff9c8;
  int iVar10;
  hasher *in_stack_fffffffffffff9d0;
  undefined4 in_stack_fffffffffffff9d8;
  Type in_stack_fffffffffffff9dc;
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffff9e0;
  char *in_stack_fffffffffffffa10;
  undefined4 in_stack_fffffffffffffa18;
  undefined4 in_stack_fffffffffffffa1c;
  undefined4 in_stack_fffffffffffffa20;
  undefined2 in_stack_fffffffffffffa24;
  undefined1 in_stack_fffffffffffffa26;
  undefined1 in_stack_fffffffffffffa27;
  undefined4 in_stack_fffffffffffffa30;
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_01;
  string local_590 [48];
  key_type local_560;
  undefined1 local_559;
  AssertionResult local_558;
  string local_548 [48];
  undefined4 in_stack_fffffffffffffae8;
  undefined4 in_stack_fffffffffffffaec;
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffaf0;
  AssertionResult local_490;
  string local_480 [48];
  key_type local_450;
  undefined1 local_449;
  AssertionResult local_448 [2];
  key_type local_424;
  value_type local_3cc;
  AssertionResult local_3c8 [2];
  key_type local_3a4;
  value_type local_34c;
  AssertionResult local_348;
  string local_338 [55];
  undefined1 local_301;
  AssertionResult local_300;
  string local_2f0 [55];
  undefined1 local_2b9;
  AssertionResult local_2b8;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_2a8;
  Hasher local_298;
  Hasher local_28c;
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  local_280;
  string local_1e0 [55];
  undefined1 local_1a9;
  AssertionResult local_1a8;
  string local_198 [55];
  undefined1 local_161;
  AssertionResult local_160;
  FILE *local_150;
  key_type local_148;
  key_type local_144;
  value_type local_e8;
  int local_e4;
  key_type local_e0;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_d0;
  Hasher local_c0;
  undefined1 local_b4 [180];
  
  bVar1 = google::
          HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::supports_serialization
                    ((HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)(in_RDI + 0x10));
  if (bVar1) {
    this_01 = (BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               *)local_b4;
    Hasher::Hasher((Hasher *)this_01,0);
    Hasher::Hasher(&local_c0,0);
    key = (key_type *)0x0;
    Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_d0,0,(int *)0x0);
    google::
    HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_SparseHashtable
              (in_stack_fffffffffffff9e0,
               CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
               in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,
               (allocator_type *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
    Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_d0);
    local_e0 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                           (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_deleted_key((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                      (key_type *)in_stack_fffffffffffff9a8);
    for (local_e4 = 1; iVar10 = (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20), local_e4 < 100;
        local_e4 = local_e4 + 1) {
      local_e8 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                                iVar10);
      google::
      BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert(in_stack_fffffffffffffaf0,
               (value_type *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
    }
    local_144 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),iVar10)
    ;
    google::
    BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
            (key_type *)in_stack_fffffffffffff9a8);
    kVar4 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                        (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
    local_148 = kVar4;
    google::
    BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
            (key_type *)in_stack_fffffffffffff9a8);
    assertion_result = tmpfile();
    local_161 = assertion_result != (FILE *)0x0;
    local_150 = assertion_result;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
               in_stack_fffffffffffff9a8,(type *)0xf20b3f);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_160);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff9e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)assertion_result,
                 (char *)CONCAT17(in_stack_fffffffffffffa27,
                                  CONCAT16(in_stack_fffffffffffffa26,
                                           CONCAT24(in_stack_fffffffffffffa24,
                                                    in_stack_fffffffffffffa20))),
                 (char *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                 in_stack_fffffffffffffa10);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc,
                 (char *)in_stack_fffffffffffff9d0,(int)((ulong)in_stack_fffffffffffff9c8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(kVar4,in_stack_fffffffffffffa30),
                 (Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
      std::__cxx11::string::~string(local_198);
      testing::Message::~Message((Message *)0xf20c02);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf20c96);
    uVar2 = google::
            BaseHashtableInterface<google::sparse_hashtable<int,int,Hasher,Negation<int>,SetKey<int,Negation<int>>,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
            ::serialize<ValueSerializer,_IO_FILE>
                      ((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)(local_b4 + 0xc),local_150);
    local_1a9 = uVar2;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
               in_stack_fffffffffffff9a8,(type *)0xf20cd7);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff9e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)assertion_result,
                 (char *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffa26,
                                                 CONCAT24(in_stack_fffffffffffffa24,
                                                          in_stack_fffffffffffffa20))),
                 (char *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                 in_stack_fffffffffffffa10);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc,
                 (char *)in_stack_fffffffffffff9d0,(int)((ulong)in_stack_fffffffffffff9c8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(kVar4,in_stack_fffffffffffffa30),
                 (Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
      std::__cxx11::string::~string(local_1e0);
      testing::Message::~Message((Message *)0xf20dac);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf20e43);
    rewind(local_150);
    Hasher::Hasher(&local_28c,0);
    Hasher::Hasher(&local_298,0);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_2a8,0,(int *)0x0);
    google::
    HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_SparseHashtable
              (in_stack_fffffffffffff9e0,
               CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
               in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,
               (allocator_type *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
    Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_2a8);
    local_2b9 = local_150 != (FILE *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
               in_stack_fffffffffffff9a8,(type *)0xf20eeb);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2b8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff9e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)assertion_result,
                 (char *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffa26,
                                                 CONCAT24(in_stack_fffffffffffffa24,
                                                          in_stack_fffffffffffffa20))),
                 (char *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                 in_stack_fffffffffffffa10);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc,
                 (char *)in_stack_fffffffffffff9d0,(int)((ulong)in_stack_fffffffffffff9c8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(kVar4,in_stack_fffffffffffffa30),
                 (Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
      std::__cxx11::string::~string(local_2f0);
      testing::Message::~Message((Message *)0xf20fff);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf21093);
    uVar3 = google::
            BaseHashtableInterface<google::sparse_hashtable<int,int,Hasher,Negation<int>,SetKey<int,Negation<int>>,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
            ::unserialize<ValueSerializer,_IO_FILE>(&local_280,local_150);
    local_301 = uVar3;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
               in_stack_fffffffffffff9a8,(type *)0xf210d4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_300);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff9e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)assertion_result,
                 (char *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT24(in_stack_fffffffffffffa24,
                                                                in_stack_fffffffffffffa20))),
                 (char *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                 in_stack_fffffffffffffa10);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc,
                 (char *)in_stack_fffffffffffff9d0,(int)((ulong)in_stack_fffffffffffff9c8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(kVar4,in_stack_fffffffffffffa30),
                 (Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
      std::__cxx11::string::~string(local_338);
      testing::Message::~Message((Message *)0xf211a9);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf21240);
    fclose(local_150);
    vVar5 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                           (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
    local_34c = vVar5;
    kVar6 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                        (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
    local_3a4 = kVar6;
    google::
    BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(this_01,key);
    expected_predicate_value =
         google::
         sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         ::operator*((sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)0xf212c1);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)in_stack_fffffffffffff9c8,
               (char *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
               in_stack_fffffffffffff9b8,
               (int *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_348);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff9e0);
      testing::AssertionResult::failure_message((AssertionResult *)0xf21338);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc,
                 (char *)in_stack_fffffffffffff9d0,(int)((ulong)in_stack_fffffffffffff9c8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(kVar4,in_stack_fffffffffffffa30),
                 (Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
      testing::Message::~Message((Message *)0xf21395);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf21406);
    local_3cc = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                               (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
    local_424 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                            (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(this_01,key);
    google::
    sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*((sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 *)0xf21478);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)in_stack_fffffffffffff9c8,
               (char *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
               in_stack_fffffffffffff9b8,
               (int *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3c8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff9e0);
      testing::AssertionResult::failure_message((AssertionResult *)0xf214ef);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc,
                 (char *)in_stack_fffffffffffff9d0,(int)((ulong)in_stack_fffffffffffff9c8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(kVar4,in_stack_fffffffffffffa30),
                 (Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
      testing::Message::~Message((Message *)0xf2154c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf215bd);
    local_450 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                            (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
    this_00 = (AssertHelper *)
              google::
              BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                      (key_type *)in_stack_fffffffffffff9a8);
    local_449 = this_00 == (AssertHelper *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
               in_stack_fffffffffffff9a8,(type *)0xf21625);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_448);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)assertion_result,
                 (char *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT24(in_stack_fffffffffffffa24,vVar5))),
                 (char *)CONCAT44(kVar6,in_stack_fffffffffffffa18),(char *)expected_predicate_value)
      ;
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (this_00,in_stack_fffffffffffff9dc,(char *)in_stack_fffffffffffff9d0,
                 (int)((ulong)in_stack_fffffffffffff9c8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(kVar4,in_stack_fffffffffffffa30),
                 (Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
      std::__cxx11::string::~string(local_480);
      testing::Message::~Message((Message *)0xf216fa);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf21791);
    type = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                          (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
    HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(this_01,key);
    file = google::
           sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::operator*((sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                        *)0xf21803);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)in_stack_fffffffffffff9c8,
               (char *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
               in_stack_fffffffffffff9b8,
               (int *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
    iVar10 = (int)((ulong)in_stack_fffffffffffff9c8 >> 0x20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_490);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      pcVar9 = testing::AssertionResult::failure_message((AssertionResult *)0xf2187a);
      iVar10 = (int)((ulong)pcVar9 >> 0x20);
      testing::internal::AssertHelper::AssertHelper
                (this_00,type,(char *)file,iVar10,
                 (char *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(kVar4,in_stack_fffffffffffffa30),
                 (Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
      testing::Message::~Message((Message *)0xf218d7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf21948);
    kVar7 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                        (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::count((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
            (key_type *)in_stack_fffffffffffff9a8);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
               in_stack_fffffffffffff9a8,(type *)0xf219b0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffaf0);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)assertion_result,
                 (char *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT24(in_stack_fffffffffffffa24,vVar5))),
                 (char *)CONCAT44(kVar6,in_stack_fffffffffffffa18),(char *)expected_predicate_value)
      ;
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (this_00,type,(char *)file,iVar10,(char *)CONCAT44(kVar7,in_stack_fffffffffffff9c0))
      ;
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(kVar4,in_stack_fffffffffffffa30),
                 (Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
      std::__cxx11::string::~string(local_548);
      testing::Message::~Message((Message *)0xf21a85);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf21b1c);
    kVar8 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                        (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
    local_560 = kVar8;
    success = (bool *)google::
                      BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::count((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                               *)CONCAT44(kVar8,in_stack_fffffffffffff9b0),
                              (key_type *)in_stack_fffffffffffff9a8);
    local_559 = success == (bool *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT44(kVar8,in_stack_fffffffffffff9b0),success,(type *)0xf21b82
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_558);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)assertion_result,
                 (char *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT24(in_stack_fffffffffffffa24,vVar5))),
                 (char *)CONCAT44(kVar6,in_stack_fffffffffffffa18),(char *)expected_predicate_value)
      ;
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (this_00,type,(char *)file,iVar10,(char *)CONCAT44(kVar7,in_stack_fffffffffffff9c0))
      ;
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(kVar4,in_stack_fffffffffffffa30),
                 (Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(kVar8,in_stack_fffffffffffff9b0));
      std::__cxx11::string::~string(local_590);
      testing::Message::~Message((Message *)0xf21c57);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf21ceb);
    google::
    HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_SparseHashtable
              ((HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xf21cf8);
    google::
    HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_SparseHashtable
              ((HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xf21d05);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Serialization) {
  if (!this->ht_.supports_serialization()) return;
  TypeParam ht_out;
  ht_out.set_deleted_key(this->UniqueKey(2000));
  for (int i = 1; i < 100; i++) {
    ht_out.insert(this->UniqueObject(i));
  }
  // just to test having some erased keys when we write.
  ht_out.erase(this->UniqueKey(56));
  ht_out.erase(this->UniqueKey(22));

  auto fp = tmpfile();
  EXPECT_TRUE(fp != NULL);
  EXPECT_TRUE(ht_out.serialize(ValueSerializer(), fp));
  rewind(fp);

  TypeParam ht_in;
  EXPECT_TRUE(fp != NULL);
  EXPECT_TRUE(ht_in.unserialize(ValueSerializer(), fp));
  fclose(fp);

  EXPECT_EQ(this->UniqueObject(1), *ht_in.find(this->UniqueKey(1)));
  EXPECT_EQ(this->UniqueObject(99), *ht_in.find(this->UniqueKey(99)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(100)));
  EXPECT_EQ(this->UniqueObject(21), *ht_in.find(this->UniqueKey(21)));
  // should not have been saved
  EXPECT_FALSE(ht_in.count(this->UniqueKey(22)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(56)));
}